

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* ParseTorReplyMapping
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,string *s)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *p_Var3;
  char cVar4;
  _Rb_tree_color _Var5;
  mapped_type *this;
  _Base_ptr p_Var6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long in_FS_OFFSET;
  string escaped_value;
  string value;
  string key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapping;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl;
  uVar12 = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar13 = s->_M_string_length;
    if (uVar13 <= uVar12) goto LAB_00abca91;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    do {
      cVar4 = (s->_M_dataplus)._M_p[uVar12];
      if ((cVar4 == ' ') || (cVar4 == '=')) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_88,cVar4);
      uVar12 = uVar12 + 1;
      uVar13 = s->_M_string_length;
    } while (uVar12 < uVar13);
    if (uVar12 == uVar13) {
LAB_00abc7a7:
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var6;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var6;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      iVar14 = 1;
    }
    else {
      pcVar2 = (s->_M_dataplus)._M_p;
      iVar14 = 3;
      if (pcVar2[uVar12] != ' ') {
        uVar9 = uVar12 + 1;
        if ((uVar9 < uVar13) && (pcVar2[uVar9] == '\"')) {
          uVar9 = uVar12 + 2;
          if ((uVar9 < uVar13) && (cVar4 = (s->_M_dataplus)._M_p[uVar9], cVar4 != '\"')) {
            bVar8 = 0;
            uVar12 = uVar12 + 3;
            do {
              uVar9 = uVar12;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(&local_a8,cVar4);
              uVar13 = s->_M_string_length;
              if (uVar13 <= uVar9) break;
              bVar8 = (bVar8 ^ 1) & cVar4 == '\\';
              cVar4 = (s->_M_dataplus)._M_p[uVar9];
              uVar12 = uVar9 + 1;
            } while ((bool)(cVar4 != '\"' | bVar8));
          }
          uVar12 = uVar9;
          if (uVar12 == uVar13) goto LAB_00abc7a7;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          local_c8._M_string_length = 0;
          local_c8.field_2._M_local_buf[0] = '\0';
          if (local_a8._M_string_length != 0) {
            uVar13 = 0;
            do {
              if (local_a8._M_dataplus._M_p[uVar13] == '\\') {
                uVar9 = uVar13 + 1;
                bVar8 = local_a8._M_dataplus._M_p[uVar13 + 1];
                if (bVar8 == 0x74) {
                  bVar8 = 9;
                }
                else if (bVar8 == 0x72) {
                  bVar8 = 0xd;
                }
                else if (bVar8 == 0x6e) {
                  bVar8 = 10;
                }
                else if ((bVar8 & 0xf8) == 0x30) {
                  uVar11 = uVar13 + 2;
                  lVar7 = -1;
                  do {
                    if ((local_a8._M_string_length <= uVar11) ||
                       ((local_a8._M_dataplus._M_p[uVar11] & 0xf8U) != 0x30)) {
                      uVar11 = -lVar7;
                      goto LAB_00abc99b;
                    }
                    lVar7 = lVar7 + -1;
                    uVar11 = uVar11 + 1;
                  } while (lVar7 != -3);
                  uVar11 = (ulong)('3' < (char)bVar8) ^ 3;
LAB_00abc99b:
                  if (uVar9 < uVar11 + uVar9) {
                    uVar9 = 0;
                    cVar4 = '\0';
                    do {
                      cVar4 = cVar4 * '\b' + local_a8._M_dataplus._M_p[uVar9 + uVar13 + 1] + -0x30;
                      uVar9 = uVar9 + 1;
                    } while (uVar11 != uVar9);
                    uVar13 = uVar13 + uVar11;
                  }
                  else {
                    cVar4 = '\0';
                  }
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  push_back(&local_c8,cVar4);
                  goto LAB_00abc982;
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back(&local_c8,bVar8);
                uVar13 = uVar9;
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back(&local_c8,local_a8._M_dataplus._M_p[uVar13]);
              }
LAB_00abc982:
              uVar13 = uVar13 + 1;
            } while (uVar13 < local_a8._M_string_length);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_a8,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,
                            CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                     local_c8.field_2._M_local_buf[0]) + 1);
          }
          uVar13 = s->_M_string_length;
          uVar9 = uVar12 + 1;
        }
        else if ((uVar9 < uVar13) && (cVar4 = (s->_M_dataplus)._M_p[uVar9], cVar4 != ' ')) {
          uVar12 = uVar12 + 2;
          do {
            uVar9 = uVar12;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_a8,cVar4);
            uVar13 = s->_M_string_length;
            if (uVar13 <= uVar9) break;
            cVar4 = (s->_M_dataplus)._M_p[uVar9];
            uVar12 = uVar9 + 1;
          } while (cVar4 != ' ');
        }
        uVar12 = uVar9;
        if (uVar12 < uVar13) {
          uVar12 = ((s->_M_dataplus)._M_p[uVar12] == ' ') + uVar12;
        }
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_68,&local_88);
        iVar14 = 0;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this,&local_a8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
  } while (iVar14 == 0);
  if (iVar14 == 3) {
LAB_00abca91:
    if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      _Var5 = _S_red;
      p_Var10 = p_Var6;
    }
    else {
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var6;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           local_68._M_impl.super__Rb_tree_header._M_node_count;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var1 = &local_68._M_impl.super__Rb_tree_header;
      p_Var3 = &local_68._M_impl;
      p_Var6 = local_68._M_impl.super__Rb_tree_header._M_header._M_right;
      p_Var10 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      _Var5 = local_68._M_impl.super__Rb_tree_header._M_header._M_color;
      local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var10;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var6;
    (p_Var3->super__Rb_tree_header)._M_node_count = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var5;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string,std::string> ParseTorReplyMapping(const std::string &s)
{
    std::map<std::string,std::string> mapping;
    size_t ptr=0;
    while (ptr < s.size()) {
        std::string key, value;
        while (ptr < s.size() && s[ptr] != '=' && s[ptr] != ' ') {
            key.push_back(s[ptr]);
            ++ptr;
        }
        if (ptr == s.size()) // unexpected end of line
            return std::map<std::string,std::string>();
        if (s[ptr] == ' ') // The remaining string is an OptArguments
            break;
        ++ptr; // skip '='
        if (ptr < s.size() && s[ptr] == '"') { // Quoted string
            ++ptr; // skip opening '"'
            bool escape_next = false;
            while (ptr < s.size() && (escape_next || s[ptr] != '"')) {
                // Repeated backslashes must be interpreted as pairs
                escape_next = (s[ptr] == '\\' && !escape_next);
                value.push_back(s[ptr]);
                ++ptr;
            }
            if (ptr == s.size()) // unexpected end of line
                return std::map<std::string,std::string>();
            ++ptr; // skip closing '"'
            /**
             * Unescape value. Per https://spec.torproject.org/control-spec section 2.1.1:
             *
             *   For future-proofing, controller implementers MAY use the following
             *   rules to be compatible with buggy Tor implementations and with
             *   future ones that implement the spec as intended:
             *
             *     Read \n \t \r and \0 ... \377 as C escapes.
             *     Treat a backslash followed by any other character as that character.
             */
            std::string escaped_value;
            for (size_t i = 0; i < value.size(); ++i) {
                if (value[i] == '\\') {
                    // This will always be valid, because if the QuotedString
                    // ended in an odd number of backslashes, then the parser
                    // would already have returned above, due to a missing
                    // terminating double-quote.
                    ++i;
                    if (value[i] == 'n') {
                        escaped_value.push_back('\n');
                    } else if (value[i] == 't') {
                        escaped_value.push_back('\t');
                    } else if (value[i] == 'r') {
                        escaped_value.push_back('\r');
                    } else if ('0' <= value[i] && value[i] <= '7') {
                        size_t j;
                        // Octal escape sequences have a limit of three octal digits,
                        // but terminate at the first character that is not a valid
                        // octal digit if encountered sooner.
                        for (j = 1; j < 3 && (i+j) < value.size() && '0' <= value[i+j] && value[i+j] <= '7'; ++j) {}
                        // Tor restricts first digit to 0-3 for three-digit octals.
                        // A leading digit of 4-7 would therefore be interpreted as
                        // a two-digit octal.
                        if (j == 3 && value[i] > '3') {
                            j--;
                        }
                        const auto end{i + j};
                        uint8_t val{0};
                        while (i < end) {
                            val *= 8;
                            val += value[i++] - '0';
                        }
                        escaped_value.push_back(char(val));
                        // Account for automatic incrementing at loop end
                        --i;
                    } else {
                        escaped_value.push_back(value[i]);
                    }
                } else {
                    escaped_value.push_back(value[i]);
                }
            }
            value = escaped_value;
        } else { // Unquoted value. Note that values can contain '=' at will, just no spaces
            while (ptr < s.size() && s[ptr] != ' ') {
                value.push_back(s[ptr]);
                ++ptr;
            }
        }
        if (ptr < s.size() && s[ptr] == ' ')
            ++ptr; // skip ' ' after key=value
        mapping[key] = value;
    }
    return mapping;
}